

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O1

void __thiscall
Diligent::anon_unknown_1::FormatToGLInternalTexFormatMap::FormatToGLInternalTexFormatMap
          (FormatToGLInternalTexFormatMap *this)

{
  memset(&TexFormatToGLInternalTexFormat::FormatMap,0,0x1a8);
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[1] = 0x8814;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[2] = 0x8814;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[3] = 0x8d70;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[4] = 0x8d82;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[5] = 0x8815;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[6] = 0x8815;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[7] = 0x8d71;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[8] = 0x8d83;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[9] = 0x881a;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[10] = 0x881a;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xb] = 0x805b;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xc] = 0x8d76;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xd] = 0x8f9b;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xe] = 0x8d88;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0xf] = 0x8230;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x10] = 0x8230;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x11] = 0x823c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x12] = 0x823b;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x13] = 0x8cad;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x14] = 0x8cad;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x15] = 0x8cad;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x16] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x17] = 0x8059;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x18] = 0x8059;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x19] = 0x906f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1a] = 0x8c3a;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1b] = 0x8058;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1c] = 0x8058;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1d] = 0x8c43;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1e] = 0x8d7c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x1f] = 0x8f97;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x20] = 0x8d8e;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x21] = 0x822f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x22] = 0x822f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x23] = 0x822c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x24] = 0x823a;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x25] = 0x8f99;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x26] = 0x8239;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x27] = 0x822e;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x28] = 0x8cac;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x29] = 0x822e;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2a] = 0x8236;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2b] = 0x8235;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2c] = 0x88f0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2d] = 0x88f0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2e] = 0x88f0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x2f] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x30] = 0x822b;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x31] = 0x822b;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x32] = 0x8238;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x33] = 0x8f95;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x34] = 0x8237;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x35] = 0x822d;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x36] = 0x822d;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x37] = 0x81a5;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x38] = 0x822a;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x39] = 0x8234;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3a] = 0x8f98;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3b] = 0x8233;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3c] = 0x8229;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3d] = 0x8229;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3e] = 0x8232;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x3f] = 0x8f94;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x40] = 0x8231;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x41] = 0x8229;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x42] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x43] = 0x8c3d;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x44] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x45] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x46] = 0x83f0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x47] = 0x83f0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x48] = 0x8c4c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x49] = 0x83f2;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4a] = 0x83f2;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4b] = 0x8c4e;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4c] = 0x83f3;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4d] = 0x83f3;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4e] = 0x8c4f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x4f] = 0x8dbb;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x50] = 0x8dbb;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x51] = 0x8dbc;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x52] = 0x8dbd;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x53] = 0x8dbd;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x54] = 0x8dbe;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x55] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x56] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x57] = 0x8058;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5c] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5d] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x58] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x59] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5a] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5b] = 0;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5e] = 0x8e8f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x5f] = 0x8e8f;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x60] = 0x8e8e;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x61] = 0x8e8c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x62] = 0x8e8c;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[99] = 0x8e8d;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[100] = 0x9274;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x65] = 0x9275;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x66] = 0x9276;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x67] = 0x9277;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x68] = 0x9278;
  TexFormatToGLInternalTexFormat::FormatMap.m_FmtToGLFmtMap._M_elems[0x69] = 0x9279;
  return;
}

Assistant:

FormatToGLInternalTexFormatMap()
    {
        // clang-format off
        // http://www.opengl.org/wiki/Image_Format
        m_FmtToGLFmtMap[TEX_FORMAT_UNKNOWN]                = 0;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_TYPELESS]        = GL_RGBA32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_FLOAT]           = GL_RGBA32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_UINT]            = GL_RGBA32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_SINT]            = GL_RGBA32I;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_TYPELESS]         = GL_RGB32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_FLOAT]            = GL_RGB32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_UINT]             = GL_RGB32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_SINT]             = GL_RGB32I;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_TYPELESS]        = GL_RGBA16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_FLOAT]           = GL_RGBA16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_UNORM]           = GL_RGBA16;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_UINT]            = GL_RGBA16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_SNORM]           = GL_RGBA16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_SINT]            = GL_RGBA16I;

        m_FmtToGLFmtMap[TEX_FORMAT_RG32_TYPELESS]          = GL_RG32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_FLOAT]             = GL_RG32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_UINT]              = GL_RG32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_SINT]              = GL_RG32I;

        m_FmtToGLFmtMap[TEX_FORMAT_R32G8X24_TYPELESS]      = GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_D32_FLOAT_S8X24_UINT]   = GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS]=GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_X32_TYPELESS_G8X24_UINT]= 0;//GL_DEPTH32F_STENCIL8;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_TYPELESS]       = GL_RGB10_A2;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_UNORM]          = GL_RGB10_A2;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_UINT]           = GL_RGB10_A2UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R11G11B10_FLOAT]        = GL_R11F_G11F_B10F;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_TYPELESS]         = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UNORM]            = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UNORM_SRGB]       = GL_SRGB8_ALPHA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UINT]             = GL_RGBA8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_SNORM]            = GL_RGBA8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_SINT]             = GL_RGBA8I;

        m_FmtToGLFmtMap[TEX_FORMAT_RG16_TYPELESS]          = GL_RG16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_FLOAT]             = GL_RG16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_UNORM]             = GL_RG16;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_UINT]              = GL_RG16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_SNORM]             = GL_RG16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_SINT]              = GL_RG16I;

        m_FmtToGLFmtMap[TEX_FORMAT_R32_TYPELESS]           = GL_R32F;
        m_FmtToGLFmtMap[TEX_FORMAT_D32_FLOAT]              = GL_DEPTH_COMPONENT32F;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_FLOAT]              = GL_R32F;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_UINT]               = GL_R32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_SINT]               = GL_R32I;

        m_FmtToGLFmtMap[TEX_FORMAT_R24G8_TYPELESS]         = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_D24_UNORM_S8_UINT]      = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_R24_UNORM_X8_TYPELESS]  = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_X24_TYPELESS_G8_UINT]   = 0;//GL_DEPTH24_STENCIL8;

        m_FmtToGLFmtMap[TEX_FORMAT_RG8_TYPELESS]           = GL_RG8;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_UNORM]              = GL_RG8;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_UINT]               = GL_RG8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_SNORM]              = GL_RG8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_SINT]               = GL_RG8I;

        m_FmtToGLFmtMap[TEX_FORMAT_R16_TYPELESS]           = GL_R16F;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_FLOAT]              = GL_R16F;
        m_FmtToGLFmtMap[TEX_FORMAT_D16_UNORM]              = GL_DEPTH_COMPONENT16;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_UNORM]              = GL_R16;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_UINT]               = GL_R16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_SNORM]              = GL_R16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_SINT]               = GL_R16I;

        m_FmtToGLFmtMap[TEX_FORMAT_R8_TYPELESS]            = GL_R8;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_UNORM]               = GL_R8;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_UINT]                = GL_R8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_SNORM]               = GL_R8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_SINT]                = GL_R8I;
        // To get the same behaviour as expected for TEX_FORMAT_A8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        m_FmtToGLFmtMap[TEX_FORMAT_A8_UNORM]               = GL_R8;

        m_FmtToGLFmtMap[TEX_FORMAT_R1_UNORM]               = 0;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB9E5_SHAREDEXP]       = GL_RGB9_E5;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_B8G8_UNORM]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_G8R8_G8B8_UNORM]        = 0;

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_TYPELESS]           = GL_COMPRESSED_RGB_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_UNORM]              = GL_COMPRESSED_RGB_S3TC_DXT1_EXT;  // GL_COMPRESSED_RGBA_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_UNORM_SRGB]         = GL_COMPRESSED_SRGB_S3TC_DXT1_EXT; // GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_TYPELESS]           = GL_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_UNORM]              = GL_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_TYPELESS]           = GL_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_UNORM]              = GL_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_TYPELESS]           = GL_COMPRESSED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_UNORM]              = GL_COMPRESSED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_SNORM]              = GL_COMPRESSED_SIGNED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_TYPELESS]           = GL_COMPRESSED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_UNORM]              = GL_COMPRESSED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_SNORM]              = GL_COMPRESSED_SIGNED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_B5G6R5_UNORM]           = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_B5G5R5A1_UNORM]         = 0;
        // To get the same behaviour as expected for TEX_FORMAT_BGRA8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_UNORM]            = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_UNORM]            = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM] = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_TYPELESS]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_UNORM_SRGB]       = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_TYPELESS]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_UNORM_SRGB]       = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_TYPELESS]          = GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_UF16]              = GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_SF16]              = GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_TYPELESS]           = GL_COMPRESSED_RGBA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_UNORM]              = GL_COMPRESSED_RGBA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM]        = GL_COMPRESSED_RGB8_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM_SRGB]   = GL_COMPRESSED_SRGB8_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM]      = GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB] = GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM]       = GL_COMPRESSED_RGBA8_ETC2_EAC;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB]  = GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC;
        // clang-format on

        static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please enter the new format information above");
    }